

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O0

mg_value * mg_value_make_bool(int val)

{
  int in_EDI;
  mg_value *value;
  size_t in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  mg_value *local_8;
  
  local_8 = (mg_value *)
            mg_allocator_malloc((mg_allocator *)CONCAT44(in_EDI,in_stack_fffffffffffffff0),
                                in_stack_ffffffffffffffe8);
  if (local_8 == (mg_value *)0x0) {
    local_8 = (mg_value *)0x0;
  }
  else {
    local_8->type = MG_VALUE_TYPE_BOOL;
    (local_8->field_1).bool_v = in_EDI;
  }
  return local_8;
}

Assistant:

mg_value *mg_value_make_bool(int val) {
  mg_value *value = mg_allocator_malloc(&mg_system_allocator, sizeof(mg_value));
  if (!value) {
    return NULL;
  }
  value->type = MG_VALUE_TYPE_BOOL;
  value->bool_v = val;
  return value;
}